

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPCMacAlgorithm.cpp
# Opt level: O2

bool __thiscall
OSSLEVPCMacAlgorithm::verifyUpdate(OSSLEVPCMacAlgorithm *this,ByteString *originalData)

{
  CMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *data;
  ByteString dummy;
  
  bVar1 = MacAlgorithm::verifyUpdate(&this->super_MacAlgorithm,originalData);
  if (bVar1) {
    sVar3 = ByteString::size(originalData);
    if (sVar3 == 0) {
      return true;
    }
    ctx = (CMAC_CTX *)this->curCTX;
    data = ByteString::const_byte_str(originalData);
    sVar3 = ByteString::size(originalData);
    iVar2 = CMAC_Update(ctx,data,sVar3);
    if (iVar2 != 0) {
      return true;
    }
    softHSMLog(3,"verifyUpdate",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
               ,0xcd,"CMAC_Update failed");
    CMAC_CTX_free((CMAC_CTX *)this->curCTX);
    this->curCTX = (CMAC_CTX *)0x0;
    ByteString::ByteString(&dummy);
    MacAlgorithm::verifyFinal(&this->super_MacAlgorithm,&dummy);
    ByteString::~ByteString(&dummy);
  }
  return false;
}

Assistant:

bool OSSLEVPCMacAlgorithm::verifyUpdate(const ByteString& originalData)
{
	if (!MacAlgorithm::verifyUpdate(originalData))
	{
		return false;
	}

	if (originalData.size() == 0) return true;

	if (!CMAC_Update(curCTX, originalData.const_byte_str(), originalData.size()))
	{
		ERROR_MSG("CMAC_Update failed");

		CMAC_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		MacAlgorithm::verifyFinal(dummy);

		return false;
	}

	return true;
}